

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void console_draw_pct(float _pct)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  int i;
  int iVar5;
  ulong uVar6;
  float fVar7;
  string deleteLine;
  long *local_68;
  long local_60;
  long local_58 [2];
  undefined1 local_48 [16];
  
  if (((cmd_win != (WINDOW *)0x0) && (out_win != (WINDOW *)0x0)) && (stt_win != (WINDOW *)0x0)) {
    uVar6 = (long)cmd_win->_maxx - 3;
    werase();
    box(cmd_win,0,0);
    if ((long)uVar6 < 0) {
      fVar7 = (float)uVar6;
    }
    else {
      fVar7 = (float)(int)uVar6;
    }
    local_48 = ZEXT416((uint)fVar7);
    wattr_on(cmd_win,0x200,0);
    if (uVar6 != 0) {
      fVar7 = (float)local_48._0_4_ * _pct;
      uVar2 = (ulong)fVar7;
      uVar3 = 0;
      do {
        pcVar4 = ".";
        if (uVar3 < ((long)(fVar7 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2)) {
          pcVar4 = "#";
        }
        mvwprintw(cmd_win,1,(int)uVar3 + 2,"%s",pcVar4);
        uVar3 = uVar3 + 1;
      } while (uVar6 != uVar3);
    }
    wattr_off(cmd_win,0x200,0);
    wrefresh(cmd_win);
    return;
  }
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\x1b[2K\r\x1b[1A","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"// [ ",5);
  iVar5 = 0;
  do {
    pcVar4 = ".";
    if (iVar5 < (int)(_pct * 100.0) / 2) {
      pcVar4 = "#";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,1);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ] ",3);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)(_pct * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

void console_draw_pct(float _pct) {
    #if defined(SUPPORT_NCURSES)

    if (console_is_init()) {
        size_t lines, cols;
        getmaxyx(cmd_win, lines, cols);

        werase(cmd_win);
        box(cmd_win,0, 0);
        // wborder(cmd_win, '|', '|', '-', '-', '+', '+', '+', '+');

        size_t l = (cols-4) * _pct;
        wattron(cmd_win, COLOR_PAIR(2));
        for (size_t i = 0; i < cols-4; i++)
            mvwprintw(cmd_win, 1, 2 + i, "%s", (i < l )? "#" : ".");
        wattroff(cmd_win, COLOR_PAIR(2));

        wrefresh(cmd_win);
    } else 
    #endif
    {
        // Delete previous line
        const std::string deleteLine = "\e[2K\r\e[1A";
        std::cout << deleteLine;

        int pct = 100 * _pct;
        std::cout << "// [ ";
        for (int i = 0; i < 50; i++) {
            if (i < pct/2) {
                std::cout << "#";
            }
            else {
                std::cout << ".";
            }
        }
        std::cout << " ] " << pct << "%" << std::endl;
    }
}